

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_measures.cc
# Opt level: O0

int S2::GetNumPoints(S2ShapeIndex *index)

{
  int iVar1;
  long *plVar2;
  S2Shape *shape;
  int i;
  int count;
  S2ShapeIndex *index_local;
  undefined4 extraout_var;
  
  shape._4_4_ = 0;
  shape._0_4_ = 0;
  while( true ) {
    iVar1 = (*index->_vptr_S2ShapeIndex[2])();
    if (iVar1 <= (int)(uint)shape) break;
    iVar1 = (*index->_vptr_S2ShapeIndex[3])(index,(ulong)(uint)shape);
    plVar2 = (long *)CONCAT44(extraout_var,iVar1);
    if (plVar2 != (long *)0x0) {
      iVar1 = (**(code **)(*plVar2 + 0x20))();
      if (iVar1 == 0) {
        iVar1 = (**(code **)(*plVar2 + 0x10))();
        shape._4_4_ = iVar1 + shape._4_4_;
      }
    }
    shape._0_4_ = (uint)shape + 1;
  }
  return shape._4_4_;
}

Assistant:

int GetNumPoints(const S2ShapeIndex& index) {
  int count = 0;
  for (int i = 0; i < index.num_shape_ids(); ++i) {
    S2Shape* shape = index.shape(i);
    if (shape && shape->dimension() == 0) {
      count += shape->num_edges();
    }
  }
  return count;
}